

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O2

void sx_pool_destroy(sx_pool *pool,sx_alloc *alloc)

{
  sx__pool_page *psVar1;
  code *pcVar2;
  sx__pool_page *psVar3;
  
  if (pool != (sx_pool *)0x0) {
    if (pool->pages == (sx__pool_page *)0x0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0x77,"pool->pages");
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    psVar3 = pool->pages->next;
    while (psVar3 != (sx__pool_page *)0x0) {
      psVar1 = psVar3->next;
      (*alloc->alloc_cb)(psVar3,0,0x10,(char *)0x0,(char *)0x0,0,alloc->user_data);
      psVar3 = psVar1;
    }
    pool->capacity = 0;
    psVar3 = pool->pages;
    psVar3->iter = 0;
    psVar3->next = (sx__pool_page *)0x0;
    (*alloc->alloc_cb)(pool,0,0x10,(char *)0x0,(char *)0x0,0,alloc->user_data);
  }
  return;
}

Assistant:

SX_INLINE void sx_pool_destroy(sx_pool* pool, const sx_alloc* alloc)
{
    if (pool) {
        sx_assert(pool->pages);

        sx__pool_page* page = pool->pages->next;
        while (page) {
            sx__pool_page* next = page->next;
            sx_aligned_free(alloc, page, 16);
            page = next;
        }
        pool->capacity = 0;
        pool->pages->iter = 0;
        pool->pages->next = NULL;
        sx_aligned_free(alloc, pool, 16);
    }
}